

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tadsrsc.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  size_t sVar4;
  FILE *__stream;
  char *pcVar5;
  ushort **ppuVar6;
  opdef *poVar7;
  char *pcVar8;
  char **ppcVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  byte *nam;
  byte bVar13;
  opctxdef opctx;
  char buf [128];
  char inbuf [4097];
  char tmpfile [4097];
  opctxdef local_20e4;
  undefined8 local_20d8;
  FILE *local_20d0;
  byte local_20c8 [128];
  char local_2048 [4112];
  char local_1038 [4104];
  
  puts("TADS Resource Manager version 2.2.4");
  printf("Copyright (c) 1992, 1999 by Michael J. Roberts.  ");
  puts("All Rights Reserved.");
  if (argc < 2) {
    puts(
        "usage: tadsrsc [fileoptions] <resfile> [operations]\n   or: tadsrsc [fileoptions] <resfile> @<opfile> - read ops from <opfile>\nIf no operations are given, <resfile>\'s contents are listed.\nFile options:\n  -create      - create a new resource file\nOperations:\n  -type <type> - use <type> as the type for following resources\n  -replace     - add or replace resources that follow\n  -delete      - remove following resources from resfile\n  -add         - add following resources, but do not replace if present\n  <file>       - add/delete/replace resource, using filename as resource name\n  <dir>        - add/delete/replace all files in directory\n  <file>=<res> - add/delete/replace resource, using <res> as resource name\n-replace is assumed if no conflicting option is specified\nIf no -type option is specified, types are inferred from filename suffix:\n.bin, .com, and no \'.\' are assumed to be XFCN, all others HTML.\nValid resource types:\n  XFCN  - external function (executable code)\n  HTML  - graphic/sound resource for HTML TADS (JPEG, etc)"
        );
    uVar11 = 1;
    os_term(1);
    local_20e4.restype = 0;
    local_20e4.flag = 3;
    local_20e4.doing_type = 0;
    bVar1 = true;
  }
  else {
    local_20e4.restype = 0;
    local_20e4.flag = 3;
    local_20e4.doing_type = 0;
    uVar12 = 1;
    bVar1 = false;
    do {
      uVar11 = uVar12;
      if (*argv[uVar12] != '-') break;
      iVar2 = stricmp(argv[uVar12],"-create");
      if (iVar2 == 0) {
        bVar1 = true;
      }
      else {
        printf("unrecognized file option \"%s\"",argv[uVar12]);
        putchar(10);
        os_term(1);
      }
      uVar12 = uVar12 + 1;
      uVar11 = (ulong)(uint)argc;
    } while ((uint)argc != uVar12);
    bVar1 = !bVar1;
  }
  uVar10 = (int)uVar11 + 1;
  strcpy(local_2048,argv[uVar11 & 0xffffffff]);
  os_defext(local_2048,"gam");
  if (!bVar1) {
    __stream = fopen(local_2048,"wb");
    if (__stream == (FILE *)0x0) {
      printf("unable to create file",1);
      putchar(10);
      os_term(1);
    }
    puts("\nFile created.");
    pFVar3 = (FILE *)0x0;
    local_20d8 = 0;
    goto LAB_001057e1;
  }
  pFVar3 = fopen(local_2048,"rb");
  local_20d8 = CONCAT71((int7)((ulong)pFVar3 >> 8),pFVar3 != (FILE *)0x0);
  if (pFVar3 == (FILE *)0x0) {
    printf("unable to open resource file",1);
    putchar(10);
    iVar2 = 1;
LAB_00105723:
    os_term(iVar2);
  }
  else if (uVar10 == argc) {
    iVar2 = 0;
    rscproc((osfildef *)pFVar3,(osfildef *)0x0,(opdef *)0x0);
    fclose(pFVar3);
    goto LAB_00105723;
  }
  strcpy(local_1038,local_2048);
  sVar4 = strlen(local_1038);
  pcVar5 = local_1038 + sVar4;
  do {
    pcVar8 = pcVar5;
    if (pcVar8 <= local_1038) break;
    pcVar5 = pcVar8 + -1;
  } while ((0x2d < (byte)pcVar8[-1] - 0x2f) ||
          ((0x200000000801U >> ((ulong)((byte)pcVar8[-1] - 0x2f) & 0x3f) & 1) == 0));
  builtin_strncpy(pcVar8,"$TADSRSC.TMP",0xd);
  __stream = fopen(local_1038,"wb");
  if (__stream == (FILE *)0x0) {
    __stream = (FILE *)0x0;
    printf("unable to create temporary file",1);
    putchar(10);
    os_term(1);
  }
LAB_001057e1:
  local_20d0 = pFVar3;
  if ((int)uVar10 < argc) {
    if (*argv[uVar10] == '@') {
      pFVar3 = fopen(argv[uVar10] + 1,"r");
      if (pFVar3 == (FILE *)0x0) {
        printf("unable to open response file",1);
        putchar(10);
        os_term(1);
      }
      poVar7 = (opdef *)0x0;
LAB_0010584d:
      pcVar5 = fgets((char *)local_20c8,0x80,pFVar3);
      if (pcVar5 != (char *)0x0) {
        sVar4 = strlen((char *)local_20c8);
        if (((int)sVar4 != 0) && (iVar2 = (int)sVar4 + -1, local_20c8[iVar2] == 10)) {
          local_20c8[iVar2] = 0;
        }
        bVar13 = local_20c8[0];
        nam = local_20c8;
        if (-1 < (char)local_20c8[0]) {
          ppuVar6 = __ctype_b_loc();
          do {
            if ((*(byte *)((long)*ppuVar6 + (ulong)bVar13 * 2 + 1) & 0x20) == 0) {
              if (bVar13 == 0) goto LAB_0010584d;
              break;
            }
            bVar13 = nam[1];
            nam = nam + 1;
          } while (-1 < (char)bVar13);
        }
        poVar7 = addop(poVar7,(char *)nam,&local_20e4);
        goto LAB_0010584d;
      }
      fclose(pFVar3);
    }
    else {
      ppcVar9 = argv + uVar10;
      poVar7 = (opdef *)0x0;
      do {
        poVar7 = addop(poVar7,*ppcVar9,&local_20e4);
        ppcVar9 = ppcVar9 + 1;
        uVar10 = uVar10 + 1;
      } while ((int)uVar10 < argc);
    }
  }
  else {
    poVar7 = (opdef *)0x0;
  }
  pFVar3 = local_20d0;
  for (poVar7 = rscproc((osfildef *)local_20d0,(osfildef *)__stream,poVar7); poVar7 != (opdef *)0x0;
      poVar7 = poVar7->opnxt) {
    if ((poVar7->opflag & 4) == 0) {
      printf("warning: resource \"%s\" not found\n",poVar7->opres);
    }
  }
  if ((char)local_20d8 != '\0') {
    fclose(pFVar3);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (bVar1) {
    iVar2 = remove(local_2048);
    if (iVar2 != 0) {
      printf("error deleting input file",1);
      putchar(10);
      os_term(1);
    }
    iVar2 = rename(local_1038,local_2048);
    if (iVar2 != 0) {
      printf("error renaming temporary file",1);
      putchar(10);
      os_term(1);
    }
  }
  os_term(0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int       curarg;
    osfildef *fpin;
    osfildef *fpout;
    char      tmpfile[OSFNMAX + 1];
    char      inbuf[OSFNMAX + 1];
    char     *p;
    char     *infile;
    char      buf[128];
    opdef    *oplist = (opdef *)0;
    opctxdef  opctx;
    int       do_create = FALSE;

    /* print main banner */
    rscptf("TADS Resource Manager version 2.2.4\n");
    rscptf("Copyright (c) 1992, 1999 by Michael J. Roberts.  ");
    rscptf("All Rights Reserved.\n");
    if (argc < 2) usage();

    /* set default parsing options */
    opctx.restype = RESTYPE_DFLT;
    opctx.flag = OPFADD | OPFDEL;
    opctx.doing_type = FALSE;

    /* scan file options (these come before the filename) */
    for (curarg = 1 ; curarg < argc ; ++curarg)
    {
        /* check if it's an option - if not, stop looking */
        if (argv[curarg][0] != '-')
            break;
        
        /* check the option */
        if (!stricmp(argv[curarg], "-create"))
        {
            /* note that we want to create the file */
            do_create = TRUE;
        }
        else
        {
            rscptf("unrecognized file option \"%s\"", argv[curarg]);
            errexit("", 1);
        }
    }
    
    /* get the file name */
    infile = argv[curarg++];
    strcpy(inbuf, infile);
    os_defext(inbuf, "gam");

    /* open the file for reading, unless we're creating a new file */
    if (do_create)
    {
        /* creating - we have no input file */
        fpin = 0;
    }
    else if ((fpin = osfoprb(inbuf, OSFTGAME)) == 0)
    {
        /* 
         *   not creating, so the file must already exist - it doesn't, so
         *   issue an error and quit 
         */
        errexit("unable to open resource file", 1);
    }

    /* 
     *   if no operations are desired, and we're not creating a new file,
     *   just list the existing file's contents and quit 
     */
    if (curarg == argc && fpin != 0)
    {
        rscproc(fpin, (osfildef *)0, 0);
        osfcls(fpin);
        os_term(OSEXSUCC);
    }

    /*
     *   Create an output file.  If we're creating a new file, create the
     *   file named on the command line; otherwise, create a temporary
     *   file that we'll write to while working and then rename to the
     *   original input filename after we've finished with the original
     *   input file.  
     */
    if (do_create)
    {
        /* create the new file */
        if ((fpout = osfopwb(inbuf, OSFTGAME)) == 0)
            errexit("unable to create file", 1);

        /* report the creation */
        rscptf("\nFile created.\n");
    }
    else
    {
        /* generate a temporary filename */
        strcpy(tmpfile, inbuf);
        for (p = tmpfile + strlen(tmpfile) ; p > tmpfile &&
                 *(p-1) != ':' && *(p-1) != '\\' && *(p-1) != '/' ; --p);
        strcpy(p, "$TADSRSC.TMP");

        /* open the temporary file */
        if ((fpout = osfopwb(tmpfile, OSFTGAME)) == 0)
            errexit("unable to create temporary file", 1);
    }

    /* see if we need to read a response file */
    if (curarg < argc && argv[curarg][0] == '@')
    {
        osfildef *argfp;
        int       l;
        char     *p;
        
        if (!(argfp = osfoprt(argv[curarg]+1, OSFTTEXT)))
            errexit("unable to open response file", 1);
        
        for (;;)
        {
            if (!osfgets(buf, sizeof(buf), argfp)) break;
            l = strlen(buf);
            if (l && buf[l-1] == '\n') buf[--l] = '\0';
            for (p = buf ; t_isspace(*p) ; ++p);
            if (!*p) continue;
            oplist = addop(oplist, p, &opctx);
        }
        osfcls(argfp);
    }
    else
    {
        for ( ; curarg < argc ; ++curarg)
            oplist = addop(oplist, argv[curarg], &opctx);
    }

    /* process the resources */
    oplist = rscproc(fpin, fpout, oplist);

    /* make sure they all got processed */
    for ( ; oplist != 0 ; oplist = oplist->opnxt)
    {
        if (!(oplist->opflag & OPFDONE))
            rscptf("warning: resource \"%s\" not found\n", oplist->opres);
    }
    
    /* close files */
    if (fpin != 0)
        osfcls(fpin);
    if (fpout != 0)
        osfcls(fpout);
    
    /* 
     *   if we didn't create a new file, remove the original input file
     *   and rename the temp file to the original file name 
     */
    if (!do_create)
    {
        /* remove the original input file */
        if (remove(inbuf))
            errexit("error deleting input file", 1);

        /* rename the temp file to the output file */
        if (rename(tmpfile, inbuf))
            errexit("error renaming temporary file", 1);
    }

    /* success */
    os_term(OSEXSUCC);
    return OSEXSUCC;
}